

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O0

int Bmcg_ManPerformOne(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  undefined4 uVar1;
  Gia_Man_t *p_00;
  Gia_Man_t *p_01;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Gia_Obj_t *pObj;
  Abc_Cex_t *pAVar8;
  abctime aVar9;
  int local_ac;
  int local_58;
  int nOutDigits;
  int iLit;
  int iObj;
  abctime clk;
  Cnf_Dat_t *pCnf;
  int nClauses;
  int RetValue;
  int status;
  int i;
  int k;
  int f;
  Bmcg_Man_t *p;
  abctime clkStart;
  Bmc_AndPar_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  clkStart = (abctime)pPars;
  pPars_local = (Bmc_AndPar_t *)pGia;
  p = (Bmcg_Man_t *)Abc_Clock();
  _k = Bmcg_ManStart((Gia_Man_t *)pPars_local,(Bmc_AndPar_t *)clkStart);
  status = 0;
  RetValue = Gia_ManPoNum((Gia_Man_t *)pPars_local);
  pCnf._4_4_ = -1;
  pCnf._0_4_ = 0;
  Abc_CexFreeP((Abc_Cex_t **)&pPars_local[4].nProcs);
  i = 0;
  while( true ) {
    bVar2 = true;
    if (*(int *)(clkStart + 4) != 0) {
      bVar2 = i < *(int *)(clkStart + 4);
    }
    if (!bVar2) break;
    clk = (abctime)Bmcg_ManAddNewCnf(_k,i,*(int *)(clkStart + 8));
    if ((Cnf_Dat_t *)clk == (Cnf_Dat_t *)0x0) {
      Bmcg_ManPrintFrame(_k,i,(int)pCnf,-1,(abctime)p);
      if (*(long *)(clkStart + 0x50) != 0) {
        for (status = 0; status < *(int *)(clkStart + 8); status = status + 1) {
          for (RetValue = 0; iVar4 = RetValue, iVar3 = Gia_ManPoNum((Gia_Man_t *)pPars_local),
              iVar4 < iVar3; RetValue = RetValue + 1) {
            (**(code **)(clkStart + 0x50))(i + status,RetValue,0);
          }
        }
      }
    }
    else {
      pCnf._0_4_ = ((Cnf_Dat_t *)clk)->nClauses + (int)pCnf;
      Bmcg_ManAddCnf(_k,_k->pSats[0],(Cnf_Dat_t *)clk);
      Cnf_DataFree((Cnf_Dat_t *)clk);
      iVar4 = Gia_ManPoNum(_k->pFrames);
      iVar3 = i + *(int *)(clkStart + 8);
      iVar5 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
      if (iVar4 != iVar3 * iVar5) {
        __assert_fail("Gia_ManPoNum(p->pFrames) == (f + pPars->nFramesAdd) * Gia_ManPoNum(pGia)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcG.c"
                      ,0x17a,"int Bmcg_ManPerformOne(Gia_Man_t *, Bmc_AndPar_t *)");
      }
      for (status = 0; status < *(int *)(clkStart + 8); status = status + 1) {
        for (RetValue = 0; iVar4 = RetValue, iVar3 = Gia_ManPoNum((Gia_Man_t *)pPars_local),
            iVar4 < iVar3; RetValue = RetValue + 1) {
          _iLit = Abc_Clock();
          p_00 = _k->pFrames;
          p_01 = _k->pFrames;
          iVar4 = i + status;
          iVar3 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
          pObj = Gia_ManCo(p_01,iVar4 * iVar3 + RetValue);
          nOutDigits = Gia_ObjId(p_00,pObj);
          iVar4 = Vec_IntEntry(&_k->vFr2Sat,nOutDigits);
          local_58 = Abc_Var2Lit(iVar4,0);
          if ((*(int *)(clkStart + 0x10) != 0) &&
             (aVar9 = Abc_Clock(), (long)*(int *)(clkStart + 0x10) <= (aVar9 - (long)p) / 1000000))
          break;
          nClauses = bmcg_sat_solver_solve(_k->pSats[0],&local_58,1);
          aVar9 = Abc_Clock();
          iVar4 = RetValue;
          _k->timeSat = (aVar9 - _iLit) + _k->timeSat;
          if (nClauses != -1) {
            if (nClauses == 1) {
              pCnf._4_4_ = 0;
              *(int *)(clkStart + 0x40) = i + status;
              pAVar8 = Bmcg_ManGenerateCex(_k,RetValue,i + status,0);
              *(Abc_Cex_t **)&pPars_local[4].nProcs = pAVar8;
              *(int *)(clkStart + 0x44) = *(int *)(clkStart + 0x44) + 1;
              Bmcg_ManPrintFrame(_k,i + status,(int)pCnf,-1,(abctime)p);
              if (*(int *)(clkStart + 0x3c) == 0) {
                uVar6 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
                uVar6 = Abc_Base10Log(uVar6);
                iVar4 = RetValue;
                uVar7 = i + status;
                uVar1 = *(undefined4 *)(clkStart + 0x44);
                iVar3 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
                Abc_Print(1,
                          "Output %*d was asserted in frame %2d (solved %*d out of %*d outputs).  ",
                          (ulong)uVar6,(ulong)(uint)iVar4,(ulong)uVar7,(ulong)uVar6,uVar1,uVar6,
                          iVar3);
                fflush(_stdout);
              }
              if (*(long *)(clkStart + 0x50) != 0) {
                (**(code **)(clkStart + 0x50))(i + status,RetValue,1);
              }
            }
            break;
          }
          iVar3 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
          if (iVar4 == iVar3 + -1) {
            Bmcg_ManPrintFrame(_k,i + status,(int)pCnf,-1,(abctime)p);
          }
          if (*(long *)(clkStart + 0x50) != 0) {
            (**(code **)(clkStart + 0x50))(i + status,RetValue,0);
          }
        }
        iVar4 = RetValue;
        iVar3 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
        if ((iVar4 < iVar3) || (i + status == *(int *)(clkStart + 4) + -1)) break;
      }
      if (status < *(int *)(clkStart + 8)) break;
    }
    i = *(int *)(clkStart + 8) + i;
  }
  aVar9 = Abc_Clock();
  _k->timeOth = ((((aVar9 - (long)p) - _k->timeUnf) - _k->timeCnf) - _k->timeSmp) - _k->timeSat;
  if ((pCnf._4_4_ == -1) && (*(int *)(clkStart + 0x3c) == 0)) {
    if (status < *(int *)(clkStart + 8)) {
      local_ac = status + 1;
    }
    else {
      local_ac = 0;
    }
    printf("No output failed in %d frames.  ",(ulong)(uint)(i + local_ac));
  }
  aVar9 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar9 - (long)p);
  Bmcg_ManPrintTime(_k);
  Bmcg_ManStop(_k);
  return pCnf._4_4_;
}

Assistant:

int Bmcg_ManPerformOne( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    abctime clkStart = Abc_Clock();
    Bmcg_Man_t * p = Bmcg_ManStart( pGia, pPars );
    int f, k = 0, i = Gia_ManPoNum(pGia), status, RetValue = -1, nClauses = 0;
    Abc_CexFreeP( &pGia->pCexSeq );
    for ( f = 0; !pPars->nFramesMax || f < pPars->nFramesMax; f += pPars->nFramesAdd )
    {
        Cnf_Dat_t * pCnf = Bmcg_ManAddNewCnf( p, f, pPars->nFramesAdd );
        if ( pCnf == NULL )
        {
            Bmcg_ManPrintFrame( p, f, nClauses, -1, clkStart );
            if( pPars->pFuncOnFrameDone )
                for ( k = 0; k < pPars->nFramesAdd; k++ )
                for ( i = 0; i < Gia_ManPoNum(pGia); i++ )
                    pPars->pFuncOnFrameDone(f+k, i, 0);
            continue;
        }
        nClauses += pCnf->nClauses;
        Bmcg_ManAddCnf( p, p->pSats[0], pCnf );
        Cnf_DataFree( pCnf );
        assert( Gia_ManPoNum(p->pFrames) == (f + pPars->nFramesAdd) * Gia_ManPoNum(pGia) );
        for ( k = 0; k < pPars->nFramesAdd; k++ )
        {
            for ( i = 0; i < Gia_ManPoNum(pGia); i++ )
            {
                abctime clk = Abc_Clock();
                int iObj = Gia_ObjId( p->pFrames, Gia_ManCo(p->pFrames, (f+k) * Gia_ManPoNum(pGia) + i) );
                int iLit = Abc_Var2Lit( Vec_IntEntry(&p->vFr2Sat, iObj), 0 );
                if ( pPars->nTimeOut && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= pPars->nTimeOut )
                    break;
                status = bmcg_sat_solver_solve( p->pSats[0], &iLit, 1 );
                p->timeSat += Abc_Clock() - clk;
                if ( status == -1 ) // unsat
                {
                    if ( i == Gia_ManPoNum(pGia)-1 )
                        Bmcg_ManPrintFrame( p, f+k, nClauses, -1, clkStart );
                    if( pPars->pFuncOnFrameDone)
                        pPars->pFuncOnFrameDone(f+k, i, 0);
                    continue;
                }
                if ( status == 1 ) // sat
                {
                    RetValue = 0;
                    pPars->iFrame = f+k;
                    pGia->pCexSeq = Bmcg_ManGenerateCex( p, i, f+k, 0 );
                    pPars->nFailOuts++;
                    Bmcg_ManPrintFrame( p, f+k, nClauses, -1, clkStart );
                    if ( !pPars->fNotVerbose )
                    {
                        int nOutDigits = Abc_Base10Log( Gia_ManPoNum(pGia) );
                        Abc_Print( 1, "Output %*d was asserted in frame %2d (solved %*d out of %*d outputs).  ",  
                            nOutDigits, i, f+k, nOutDigits, pPars->nFailOuts, nOutDigits, Gia_ManPoNum(pGia) );
                        fflush( stdout );
                    }
                    if( pPars->pFuncOnFrameDone )
                        pPars->pFuncOnFrameDone(f+k, i, 1);
                }
                break;
            }
            if ( i < Gia_ManPoNum(pGia) || f+k == pPars->nFramesMax-1 )
                break;
        }
        if ( k < pPars->nFramesAdd )
            break;
    }
    p->timeOth = Abc_Clock() - clkStart - p->timeUnf - p->timeCnf - p->timeSmp - p->timeSat;
    if ( RetValue == -1 && !pPars->fNotVerbose )
        printf( "No output failed in %d frames.  ", f + (k < pPars->nFramesAdd ? k+1 : 0) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    Bmcg_ManPrintTime( p );
    Bmcg_ManStop( p );
    return RetValue;
}